

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

void __thiscall
glslang::TResolverInOutAdaptor::operator()
          (TResolverInOutAdaptor *this,
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          *entKey)

{
  TInfoSink *this_00;
  uint uVar1;
  int iVar2;
  TVarEntryInfo *this_01;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  undefined8 *puVar4;
  undefined4 extraout_var_01;
  char *s;
  undefined1 local_50 [8];
  TString errorMsg;
  bool isValid;
  TVarEntryInfo *ent;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *entKey_local;
  TResolverInOutAdaptor *this_local;
  
  this_01 = &entKey->second;
  TVarEntryInfo::clearNewAssignments(this_01);
  uVar1 = (*this->resolver->_vptr_TIoMapResolver[6])
                    (this->resolver,(ulong)(entKey->second).stage,this_01);
  errorMsg.field_2._M_local_buf[0xf] = (byte)uVar1 & 1;
  if ((uVar1 & 1) == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 local_50);
    iVar2 = (*(((entKey->second).symbol)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
              [0x1e])();
    plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x58))();
    if (*plVar3 == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                local_50,"Invalid shader In/Out variable: ");
      iVar2 = (*(((entKey->second).symbol)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                [0x32])();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 local_50,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_01,iVar2));
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                local_50,"Invalid shader In/Out variable semantic: ");
      iVar2 = (*(((entKey->second).symbol)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                [0x1e])();
      puVar4 = (undefined8 *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x58))();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 local_50,(char *)*puVar4);
    }
    this_00 = this->infoSink;
    s = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)local_50
             );
    TInfoSinkBase::message(&this_00->info,EPrefixInternalError,s);
    *this->error = true;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  local_50);
  }
  else {
    (*this->resolver->_vptr_TIoMapResolver[7])(this->resolver,(ulong)this->stage,this_01);
    (*this->resolver->_vptr_TIoMapResolver[8])(this->resolver,(ulong)this->stage,this_01);
    (*this->resolver->_vptr_TIoMapResolver[9])(this->resolver,(ulong)this->stage,this_01);
  }
  return;
}

Assistant:

inline void operator()(std::pair<const TString, TVarEntryInfo>& entKey)
    {
        TVarEntryInfo& ent = entKey.second;
        ent.clearNewAssignments();
        const bool isValid = resolver.validateInOut(ent.stage, ent);
        if (isValid) {
            resolver.resolveInOutLocation(stage, ent);
            resolver.resolveInOutComponent(stage, ent);
            resolver.resolveInOutIndex(stage, ent);
        } else {
            TString errorMsg;
            if (ent.symbol->getType().getQualifier().semanticName != nullptr) {
                errorMsg = "Invalid shader In/Out variable semantic: ";
                errorMsg += ent.symbol->getType().getQualifier().semanticName;
            } else {
                errorMsg = "Invalid shader In/Out variable: ";
                errorMsg += ent.symbol->getName();
            }
            infoSink.info.message(EPrefixInternalError, errorMsg.c_str());
            error = true;
        }
    }